

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

__m256i * fill_sum_epi32(__m256i a)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *in_RAX;
  undefined8 in_XMM0_Qa;
  
  auVar2._8_8_ = in_XMM0_Qa;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_XMM0_Qa;
  auVar2._24_8_ = in_XMM0_Qa;
  auVar1._8_8_ = in_XMM0_Qa;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_XMM0_Qa;
  auVar1._24_8_ = in_XMM0_Qa;
  auVar1 = vphaddd_avx2(auVar2,auVar1);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  vphaddd_avx2(auVar1,auVar1);
  return in_RAX;
}

Assistant:

static inline __m256i fill_sum_epi32(__m256i a) {
  // Given that a == [A, B, C, D, E, F, G, H]
  a = _mm256_hadd_epi32(a, a);
  // Given that A' == A + B, C' == C + D, E' == E + F, G' == G + H
  // a == [A', C', A', C', E', G', E', G']
  a = _mm256_permute4x64_epi64(a, _MM_SHUFFLE(3, 1, 2, 0));
  // a == [A', C', E', G', A', C', E', G']
  a = _mm256_hadd_epi32(a, a);
  // Given that A'' == A' + C' and E'' == E' + G'
  // a == [A'', E'', A'', E'', A'', E'', A'', E'']
  return _mm256_hadd_epi32(a, a);
  // Given that A''' == A'' + E''
  // a == [A''', A''', A''', A''', A''', A''', A''', A''']
}